

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hb.c
# Opt level: O2

int hb_ctx_log_window_buffer(heartbeat_context *hb)

{
  int iVar1;
  int *piVar2;
  
  if (hb != (heartbeat_context *)0x0) {
    iVar1 = hb_log_window_buffer(hb,(hb->ws).log_fd);
    return iVar1;
  }
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  return 0x16;
}

Assistant:

int hb_ctx_log_window_buffer(const heartbeat_context* hb) {
#endif
  if (hb == NULL) {
    errno = EINVAL;
    return errno;
  }
#if defined(HEARTBEAT_MODE_ACC)
  return hb_acc_log_window_buffer(hb, hb->ws.log_fd);
#elif defined(HEARTBEAT_MODE_POW)
  return hb_pow_log_window_buffer(hb, hb->ws.log_fd);
#elif defined(HEARTBEAT_MODE_ACC_POW)
  return hb_acc_pow_log_window_buffer(hb, hb->ws.log_fd);
#else
  return hb_log_window_buffer(hb, hb->ws.log_fd);
#endif
}